

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr1 * pcache1PinPage(PgHdr1 *pPage)

{
  uint *puVar1;
  PgHdr1 *pPVar2;
  PgHdr1 *pPVar3;
  
  pPVar2 = pPage->pLruNext;
  pPVar3 = pPage->pLruPrev;
  pPVar3->pLruNext = pPVar2;
  pPVar2->pLruPrev = pPVar3;
  pPage->pLruNext = (PgHdr1 *)0x0;
  puVar1 = &pPage->pCache->nRecyclable;
  *puVar1 = *puVar1 - 1;
  return pPage;
}

Assistant:

static PgHdr1 *pcache1PinPage(PgHdr1 *pPage){
  assert( pPage!=0 );
  assert( PAGE_IS_UNPINNED(pPage) );
  assert( pPage->pLruNext );
  assert( pPage->pLruPrev );
  assert( sqlite3_mutex_held(pPage->pCache->pGroup->mutex) );
  pPage->pLruPrev->pLruNext = pPage->pLruNext;
  pPage->pLruNext->pLruPrev = pPage->pLruPrev;
  pPage->pLruNext = 0;
  /* pPage->pLruPrev = 0;
  ** No need to clear pLruPrev as it is never accessed if pLruNext is 0 */
  assert( pPage->isAnchor==0 );
  assert( pPage->pCache->pGroup->lru.isAnchor==1 );
  pPage->pCache->nRecyclable--;
  return pPage;
}